

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_verify_seg_manifold(REF_CAVITY ref_cavity)

{
  uint uVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  
  if (ref_cavity->state != REF_CAVITY_INCONSISTENT) {
    uVar1 = ref_cavity->maxseg;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
      piVar2 = ref_cavity->s2n;
      if (piVar2[uVar6 * 3] != -1) {
        uVar5 = 0xffffffff;
        piVar7 = piVar2;
        for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
          if ((*piVar7 != -1) && (piVar2[uVar6 * 3 + 1] == *piVar7)) {
            if ((int)uVar5 != -1) {
              ref_cavity->state = REF_CAVITY_INCONSISTENT;
              return 0;
            }
            uVar5 = uVar4 & 0xffffffff;
          }
          piVar7 = piVar7 + 3;
        }
        if ((int)uVar5 == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x203,"ref_cavity_verify_seg_manifold","seg missing");
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_verify_seg_manifold(
    REF_CAVITY ref_cavity) {
  REF_INT seg0, seg1, found_seg;

  if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
    return REF_SUCCESS;

  each_ref_cavity_valid_seg(ref_cavity, seg0) {
    found_seg = REF_EMPTY;
    each_ref_cavity_valid_seg(ref_cavity, seg1) {
      if (ref_cavity_s2n(ref_cavity, 1, seg0) ==
          ref_cavity_s2n(ref_cavity, 0, seg1)) {
        if (REF_EMPTY != found_seg) { /* found seg twice */
          ref_cavity_state(ref_cavity) = REF_CAVITY_INCONSISTENT;
          return REF_SUCCESS;
        }
        found_seg = seg1;
      }
    }
    RUS(REF_EMPTY, found_seg, "seg missing");
  }

  return REF_SUCCESS;
}